

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_false,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  vfloat<4> vVar12;
  byte bVar13;
  BVH *bvh;
  void *pvVar14;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  vbool<4> vVar27;
  char cVar28;
  bool bVar29;
  uint uVar30;
  undefined4 uVar31;
  int iVar32;
  AABBNodeMB4D *node1;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  NodeRef root;
  size_t sVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  NodeRef *pNVar38;
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM0 [64];
  float fVar44;
  float fVar54;
  float fVar55;
  vint4 ai_1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  float fVar57;
  float fVar65;
  float fVar66;
  vint4 ai_11;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar67;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 ai_2;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 bi_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  float fVar89;
  float fVar91;
  vint4 bi_3;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar90;
  float fVar92;
  undefined1 auVar88 [16];
  float fVar93;
  float fVar97;
  float fVar98;
  vint4 bi_2;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  vfloat4 a0;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar121;
  float fVar122;
  vint4 ai_3;
  undefined1 auVar120 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined1 local_1968 [8];
  float fStack_1960;
  float fStack_195c;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_false> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar26 = mm_lookupmask_ps._8_8_;
  uVar25 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar36 = (bvh->root).ptr;
  if (sVar36 != 8) {
    auVar64 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar51 = vpcmpeqd_avx(auVar64,(undefined1  [16])valid_i->field_0);
    auVar64 = *(undefined1 (*) [16])(ray + 0x80);
    auVar43 = ZEXT816(0) << 0x40;
    auVar52 = vcmpps_avx(auVar64,auVar43,5);
    auVar52 = vandps_avx(auVar52,auVar51);
    uVar33 = vmovmskps_avx(auVar52);
    if (uVar33 != 0) {
      uVar34 = (ulong)(uVar33 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar78._0_4_ =
           tray.dir.field_0._0_4_ * tray.dir.field_0._0_4_ +
           tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_ +
           tray.dir.field_0._16_4_ * tray.dir.field_0._16_4_;
      auVar78._4_4_ =
           tray.dir.field_0._4_4_ * tray.dir.field_0._4_4_ +
           tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_ +
           tray.dir.field_0._20_4_ * tray.dir.field_0._20_4_;
      auVar78._8_4_ =
           tray.dir.field_0._8_4_ * tray.dir.field_0._8_4_ +
           tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_ +
           tray.dir.field_0._24_4_ * tray.dir.field_0._24_4_;
      auVar78._12_4_ =
           tray.dir.field_0._12_4_ * tray.dir.field_0._12_4_ +
           tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_ +
           tray.dir.field_0._28_4_ * tray.dir.field_0._28_4_;
      auVar51 = vrsqrtps_avx(auVar78);
      fVar82 = auVar51._0_4_;
      fVar89 = auVar51._4_4_;
      fVar57 = auVar51._8_4_;
      fVar65 = auVar51._12_4_;
      pre.depth_scale.field_0.v[0] = fVar82 * 1.5 + fVar82 * fVar82 * fVar82 * auVar78._0_4_ * -0.5;
      pre.depth_scale.field_0.v[1] = fVar89 * 1.5 + fVar89 * fVar89 * fVar89 * auVar78._4_4_ * -0.5;
      pre.depth_scale.field_0.v[2] = fVar57 * 1.5 + fVar57 * fVar57 * fVar57 * auVar78._8_4_ * -0.5;
      pre.depth_scale.field_0.v[3] = fVar65 * 1.5 + fVar65 * fVar65 * fVar65 * auVar78._12_4_ * -0.5
      ;
      auVar51._8_4_ = 0x80000000;
      auVar51._0_8_ = 0x8000000080000000;
      auVar51._12_4_ = 0x80000000;
      do {
        lVar35 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
          }
        }
        auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar35 * 4 + 0x40)),
                                ZEXT416(*(uint *)(ray + lVar35 * 4 + 0x50)),0x1c);
        auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + lVar35 * 4 + 0x60)),0x28);
        fVar82 = *(float *)((long)pre.ray_space + lVar35 * 4 + -0x10);
        auVar105._0_4_ = auVar78._0_4_ * fVar82;
        auVar105._4_4_ = auVar78._4_4_ * fVar82;
        auVar105._8_4_ = auVar78._8_4_ * fVar82;
        auVar105._12_4_ = auVar78._12_4_ * fVar82;
        auVar100 = vshufpd_avx(auVar105,auVar105,1);
        auVar78 = vmovshdup_avx(auVar105);
        auVar111._0_4_ = auVar78._0_4_ ^ 0x80000000;
        auVar78 = vunpckhps_avx(auVar105,auVar43);
        auVar111._4_12_ = ZEXT812(0) << 0x20;
        auVar109 = vshufps_avx(auVar78,auVar111,0x41);
        auVar108._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
        auVar108._8_8_ = auVar100._8_8_ ^ auVar51._8_8_;
        auVar108 = vinsertps_avx(auVar108,auVar105,0x2a);
        auVar78 = vdpps_avx(auVar109,auVar109,0x7f);
        auVar100 = vdpps_avx(auVar108,auVar108,0x7f);
        auVar78 = vcmpps_avx(auVar100,auVar78,1);
        auVar78 = vshufps_avx(auVar78,auVar78,0);
        auVar78 = vblendvps_avx(auVar108,auVar109,auVar78);
        auVar100 = vdpps_avx(auVar78,auVar78,0x7f);
        auVar108 = vrsqrtss_avx(auVar100,auVar100);
        fVar89 = auVar108._0_4_;
        auVar100 = ZEXT416((uint)(fVar89 * 1.5 - auVar100._0_4_ * 0.5 * fVar89 * fVar89 * fVar89));
        auVar100 = vshufps_avx(auVar100,auVar100,0);
        auVar109._0_4_ = auVar78._0_4_ * auVar100._0_4_;
        auVar109._4_4_ = auVar78._4_4_ * auVar100._4_4_;
        auVar109._8_4_ = auVar78._8_4_ * auVar100._8_4_;
        auVar109._12_4_ = auVar78._12_4_ * auVar100._12_4_;
        auVar78 = vshufps_avx(auVar109,auVar109,0xc9);
        auVar100 = vshufps_avx(auVar105,auVar105,0xc9);
        auVar114._0_4_ = auVar100._0_4_ * auVar109._0_4_;
        auVar114._4_4_ = auVar100._4_4_ * auVar109._4_4_;
        auVar114._8_4_ = auVar100._8_4_ * auVar109._8_4_;
        auVar114._12_4_ = auVar100._12_4_ * auVar109._12_4_;
        auVar112._0_4_ = auVar105._0_4_ * auVar78._0_4_;
        auVar112._4_4_ = auVar105._4_4_ * auVar78._4_4_;
        auVar112._8_4_ = auVar105._8_4_ * auVar78._8_4_;
        auVar112._12_4_ = auVar105._12_4_ * auVar78._12_4_;
        auVar78 = vsubps_avx(auVar112,auVar114);
        auVar108 = vshufps_avx(auVar78,auVar78,0xc9);
        auVar78 = vdpps_avx(auVar108,auVar108,0x7f);
        auVar100 = vrsqrtss_avx(auVar78,auVar78);
        fVar89 = auVar100._0_4_;
        auVar78 = ZEXT416((uint)(fVar89 * 1.5 - auVar78._0_4_ * 0.5 * fVar89 * fVar89 * fVar89));
        auVar78 = vshufps_avx(auVar78,auVar78,0);
        auVar113._0_4_ = auVar78._0_4_ * auVar108._0_4_;
        auVar113._4_4_ = auVar78._4_4_ * auVar108._4_4_;
        auVar113._8_4_ = auVar78._8_4_ * auVar108._8_4_;
        auVar113._12_4_ = auVar78._12_4_ * auVar108._12_4_;
        auVar100._0_4_ = fVar82 * auVar105._0_4_;
        auVar100._4_4_ = fVar82 * auVar105._4_4_;
        auVar100._8_4_ = fVar82 * auVar105._8_4_;
        auVar100._12_4_ = fVar82 * auVar105._12_4_;
        auVar108 = vunpcklps_avx(auVar109,auVar100);
        auVar78 = vunpckhps_avx(auVar109,auVar100);
        auVar109 = vunpcklps_avx(auVar113,auVar43);
        auVar100 = vunpckhps_avx(auVar113,auVar43);
        aVar16 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar78,auVar100);
        aVar17 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar108,auVar109);
        aVar15 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar108,auVar109);
        pre.ray_space[lVar35].vx.field_0 = aVar17;
        pre.ray_space[lVar35].vy.field_0 = aVar15;
        pre.ray_space[lVar35].vz.field_0 = aVar16;
        uVar34 = uVar34 & uVar34 - 1;
      } while (uVar34 != 0);
      auVar101._8_4_ = 0x7fffffff;
      auVar101._0_8_ = 0x7fffffff7fffffff;
      auVar101._12_4_ = 0x7fffffff;
      auVar106._8_4_ = 0x219392ef;
      auVar106._0_8_ = 0x219392ef219392ef;
      auVar106._12_4_ = 0x219392ef;
      auVar51 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar51 = vcmpps_avx(auVar51,auVar106,1);
      auVar51 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar106,auVar51)
      ;
      auVar110._8_4_ = 0x3f800000;
      auVar110._0_8_ = 0x3f8000003f800000;
      auVar110._12_4_ = 0x3f800000;
      auVar43 = vrcpps_avx(auVar51);
      fVar82 = auVar43._0_4_;
      auVar72._0_4_ = auVar51._0_4_ * fVar82;
      fVar89 = auVar43._4_4_;
      auVar72._4_4_ = auVar51._4_4_ * fVar89;
      fVar57 = auVar43._8_4_;
      auVar72._8_4_ = auVar51._8_4_ * fVar57;
      fVar65 = auVar43._12_4_;
      auVar72._12_4_ = auVar51._12_4_ * fVar65;
      auVar51 = vsubps_avx(auVar110,auVar72);
      tray.rdir.field_0._16_4_ = fVar82 + fVar82 * auVar51._0_4_;
      tray.rdir.field_0._20_4_ = fVar89 + fVar89 * auVar51._4_4_;
      tray.rdir.field_0._24_4_ = fVar57 + fVar57 * auVar51._8_4_;
      tray.rdir.field_0._28_4_ = fVar65 + fVar65 * auVar51._12_4_;
      auVar100 = ZEXT816(0) << 0x20;
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar100,5);
      auVar84._8_4_ = 0x20;
      auVar84._0_8_ = 0x2000000020;
      auVar84._12_4_ = 0x20;
      auVar94._8_4_ = 0x30;
      auVar94._0_8_ = 0x3000000030;
      auVar94._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar94,auVar84,auVar51);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      tray.org.field_0._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      tray.org.field_0._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      tray.org.field_0._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      tray.org.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x20);
      auVar51 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar51 = vcmpps_avx(auVar51,auVar106,1);
      auVar43 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar106,auVar51)
      ;
      auVar51 = vandps_avx(auVar101,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar51 = vcmpps_avx(auVar51,auVar106,1);
      auVar51 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar106,auVar51)
      ;
      auVar78 = vrcpps_avx(auVar43);
      fVar82 = auVar78._0_4_;
      auVar58._0_4_ = auVar43._0_4_ * fVar82;
      fVar89 = auVar78._4_4_;
      auVar58._4_4_ = auVar43._4_4_ * fVar89;
      fVar57 = auVar78._8_4_;
      auVar58._8_4_ = auVar43._8_4_ * fVar57;
      fVar65 = auVar78._12_4_;
      auVar58._12_4_ = auVar43._12_4_ * fVar65;
      auVar43 = vsubps_avx(auVar110,auVar58);
      tray.rdir.field_0._0_4_ = fVar82 + fVar82 * auVar43._0_4_;
      tray.rdir.field_0._4_4_ = fVar89 + fVar89 * auVar43._4_4_;
      tray.rdir.field_0._8_4_ = fVar57 + fVar57 * auVar43._8_4_;
      tray.rdir.field_0._12_4_ = fVar65 + fVar65 * auVar43._12_4_;
      auVar43 = vrcpps_avx(auVar51);
      fVar82 = auVar43._0_4_;
      auVar45._0_4_ = auVar51._0_4_ * fVar82;
      fVar89 = auVar43._4_4_;
      auVar45._4_4_ = auVar51._4_4_ * fVar89;
      fVar57 = auVar43._8_4_;
      auVar45._8_4_ = auVar51._8_4_ * fVar57;
      fVar65 = auVar43._12_4_;
      auVar45._12_4_ = auVar51._12_4_ * fVar65;
      auVar51 = vsubps_avx(auVar110,auVar45);
      tray.rdir.field_0._32_4_ = fVar82 + fVar82 * auVar51._0_4_;
      tray.rdir.field_0._36_4_ = fVar89 + fVar89 * auVar51._4_4_;
      tray.rdir.field_0._40_4_ = fVar57 + fVar57 * auVar51._8_4_;
      tray.rdir.field_0._44_4_ = fVar65 + fVar65 * auVar51._12_4_;
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar100,1);
      auVar68._8_4_ = 0x10;
      auVar68._0_8_ = 0x1000000010;
      auVar68._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar51,auVar68);
      auVar51 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar100,5);
      auVar59._8_4_ = 0x40;
      auVar59._0_8_ = 0x4000000040;
      auVar59._12_4_ = 0x40;
      auVar69._8_4_ = 0x50;
      auVar69._0_8_ = 0x5000000050;
      auVar69._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar69,auVar59,auVar51);
      auVar51 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar100);
      auVar64 = vmaxps_avx(auVar64,auVar100);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar104 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar51,auVar52);
      auVar43._8_4_ = 0xff800000;
      auVar43._0_8_ = 0xff800000ff800000;
      auVar43._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar43,auVar64,auVar52);
      auVar64 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0
                            );
      terminated.field_0.i[1] = auVar52._4_4_ ^ auVar64._4_4_;
      terminated.field_0.i[0] = auVar52._0_4_ ^ auVar64._0_4_;
      terminated.field_0.i[2] = auVar52._8_4_ ^ auVar64._8_4_;
      terminated.field_0.i[3] = auVar52._12_4_ ^ auVar64._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar33 = 3;
      }
      else {
        uVar33 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar38 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar36;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_00302e27:
      do {
        do {
          root.ptr = pNVar38[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_003035db;
          pNVar38 = pNVar38 + -1;
          paVar37 = paVar37 + -1;
          vVar12.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar37->v;
          auVar53 = ZEXT1664((undefined1  [16])vVar12.field_0);
          auVar64 = vcmpps_avx((undefined1  [16])vVar12.field_0,(undefined1  [16])tray.tfar.field_0,
                               1);
          uVar30 = vmovmskps_avx(auVar64);
        } while (uVar30 == 0);
        uVar34 = (ulong)(uVar30 & 0xff);
        uVar30 = POPCOUNT(uVar30 & 0xff);
        if (uVar33 < uVar30) {
LAB_00302e65:
          do {
            vVar27.field_0 = terminated.field_0;
            iVar32 = 4;
            lVar35 = -0x10;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_003035db;
              auVar64 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar53._0_16_,6);
              if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar64[0xf] < '\0') {
                bVar13 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar14 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar26;
                valid_o.field_0._0_8_ = uVar25;
                uVar30 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                if ((uVar30 ^ 0xf) != 0) {
                  uVar34 = (ulong)((uVar30 ^ 0xf) & 0xff);
                  do {
                    lVar35 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                      }
                    }
                    cVar28 = (**(code **)((long)pvVar14 + (ulong)bVar13 * 0x40 + 0x18))
                                       (&pre,ray,lVar35,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar28 != '\0') {
                      valid_o.field_0.i[lVar35] = -1;
                    }
                    uVar34 = uVar34 & uVar34 - 1;
                  } while (uVar34 != 0);
                  auVar104 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)))
                  ;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])valid_o.field_0,(undefined1  [16])vVar27.field_0);
                auVar64 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar64 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar64 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar64[0xf]) goto LAB_003035db;
                auVar63._8_4_ = 0xff800000;
                auVar63._0_8_ = 0xff800000ff800000;
                auVar63._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar63,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_00302e27;
            }
            uVar34 = root.ptr & 0xfffffffffffffff0;
            uVar30 = (uint)root.ptr & 7;
            auVar64 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar53._0_16_,6);
            auVar51 = auVar104._0_16_;
            sVar36 = 8;
            do {
              root.ptr = *(size_t *)(uVar34 + 0x20 + lVar35 * 2);
              if (root.ptr == 8) {
                auVar53 = ZEXT1664(auVar51);
                root.ptr = sVar36;
                break;
              }
              if ((uVar30 == 6) || (uVar30 == 1)) {
                fVar82 = *(float *)(uVar34 + 0x90 + lVar35);
                fVar89 = *(float *)(uVar34 + 0x30 + lVar35);
                auVar43 = *(undefined1 (*) [16])(ray + 0x70);
                fVar57 = auVar43._0_4_;
                fVar65 = auVar43._4_4_;
                fVar66 = auVar43._8_4_;
                fVar67 = auVar43._12_4_;
                auVar39._0_4_ = fVar57 * fVar82 + fVar89;
                auVar39._4_4_ = fVar65 * fVar82 + fVar89;
                auVar39._8_4_ = fVar66 * fVar82 + fVar89;
                auVar39._12_4_ = fVar67 * fVar82 + fVar89;
                fVar82 = *(float *)(uVar34 + 0xb0 + lVar35);
                fVar89 = *(float *)(uVar34 + 0x50 + lVar35);
                auVar46._0_4_ = fVar57 * fVar82 + fVar89;
                auVar46._4_4_ = fVar65 * fVar82 + fVar89;
                auVar46._8_4_ = fVar66 * fVar82 + fVar89;
                auVar46._12_4_ = fVar67 * fVar82 + fVar89;
                fVar82 = *(float *)(uVar34 + 0xd0 + lVar35);
                fVar89 = *(float *)(uVar34 + 0x70 + lVar35);
                auVar70._0_4_ = fVar57 * fVar82 + fVar89;
                auVar70._4_4_ = fVar65 * fVar82 + fVar89;
                auVar70._8_4_ = fVar66 * fVar82 + fVar89;
                auVar70._12_4_ = fVar67 * fVar82 + fVar89;
                fVar82 = *(float *)(uVar34 + 0xa0 + lVar35);
                fVar89 = *(float *)(uVar34 + 0x40 + lVar35);
                auVar73._0_4_ = fVar57 * fVar82 + fVar89;
                auVar73._4_4_ = fVar65 * fVar82 + fVar89;
                auVar73._8_4_ = fVar66 * fVar82 + fVar89;
                auVar73._12_4_ = fVar67 * fVar82 + fVar89;
                fVar82 = *(float *)(uVar34 + 0xc0 + lVar35);
                fVar89 = *(float *)(uVar34 + 0x60 + lVar35);
                auVar79._0_4_ = fVar57 * fVar82 + fVar89;
                auVar79._4_4_ = fVar65 * fVar82 + fVar89;
                auVar79._8_4_ = fVar66 * fVar82 + fVar89;
                auVar79._12_4_ = fVar67 * fVar82 + fVar89;
                fVar82 = *(float *)(uVar34 + 0xe0 + lVar35);
                fVar89 = *(float *)(uVar34 + 0x80 + lVar35);
                auVar85._0_4_ = fVar57 * fVar82 + fVar89;
                auVar85._4_4_ = fVar65 * fVar82 + fVar89;
                auVar85._8_4_ = fVar66 * fVar82 + fVar89;
                auVar85._12_4_ = fVar67 * fVar82 + fVar89;
                auVar20._4_4_ = tray.org.field_0._4_4_;
                auVar20._0_4_ = tray.org.field_0._0_4_;
                auVar20._8_4_ = tray.org.field_0._8_4_;
                auVar20._12_4_ = tray.org.field_0._12_4_;
                auVar21._4_4_ = tray.org.field_0._20_4_;
                auVar21._0_4_ = tray.org.field_0._16_4_;
                auVar21._8_4_ = tray.org.field_0._24_4_;
                auVar21._12_4_ = tray.org.field_0._28_4_;
                auVar78 = vsubps_avx(auVar39,auVar20);
                auVar40._0_4_ = tray.rdir.field_0._0_4_ * auVar78._0_4_;
                auVar40._4_4_ = tray.rdir.field_0._4_4_ * auVar78._4_4_;
                auVar40._8_4_ = tray.rdir.field_0._8_4_ * auVar78._8_4_;
                auVar40._12_4_ = tray.rdir.field_0._12_4_ * auVar78._12_4_;
                auVar78 = vsubps_avx(auVar46,auVar21);
                auVar47._0_4_ = tray.rdir.field_0._16_4_ * auVar78._0_4_;
                auVar47._4_4_ = tray.rdir.field_0._20_4_ * auVar78._4_4_;
                auVar47._8_4_ = tray.rdir.field_0._24_4_ * auVar78._8_4_;
                auVar47._12_4_ = tray.rdir.field_0._28_4_ * auVar78._12_4_;
                auVar78 = vsubps_avx(auVar70,(undefined1  [16])tray.org.field_0.field_0.z.field_0);
                auVar120._0_4_ = tray.rdir.field_0._32_4_ * auVar78._0_4_;
                auVar120._4_4_ = tray.rdir.field_0._36_4_ * auVar78._4_4_;
                auVar120._8_4_ = tray.rdir.field_0._40_4_ * auVar78._8_4_;
                auVar120._12_4_ = tray.rdir.field_0._44_4_ * auVar78._12_4_;
                auVar78 = vsubps_avx(auVar73,auVar20);
                auVar74._0_4_ = tray.rdir.field_0._0_4_ * auVar78._0_4_;
                auVar74._4_4_ = tray.rdir.field_0._4_4_ * auVar78._4_4_;
                auVar74._8_4_ = tray.rdir.field_0._8_4_ * auVar78._8_4_;
                auVar74._12_4_ = tray.rdir.field_0._12_4_ * auVar78._12_4_;
                auVar78 = vsubps_avx(auVar79,auVar21);
                auVar80._0_4_ = tray.rdir.field_0._16_4_ * auVar78._0_4_;
                auVar80._4_4_ = tray.rdir.field_0._20_4_ * auVar78._4_4_;
                auVar80._8_4_ = tray.rdir.field_0._24_4_ * auVar78._8_4_;
                auVar80._12_4_ = tray.rdir.field_0._28_4_ * auVar78._12_4_;
                auVar78 = vsubps_avx(auVar85,(undefined1  [16])tray.org.field_0.field_0.z.field_0);
                auVar86._0_4_ = tray.rdir.field_0._32_4_ * auVar78._0_4_;
                auVar86._4_4_ = tray.rdir.field_0._36_4_ * auVar78._4_4_;
                auVar86._8_4_ = tray.rdir.field_0._40_4_ * auVar78._8_4_;
                auVar86._12_4_ = tray.rdir.field_0._44_4_ * auVar78._12_4_;
                auVar78 = vpminsd_avx(auVar40,auVar74);
                auVar100 = vpminsd_avx(auVar47,auVar80);
                auVar78 = vpmaxsd_avx(auVar78,auVar100);
                auVar100 = vpminsd_avx(auVar120,auVar86);
                auVar100 = vpmaxsd_avx(auVar78,auVar100);
                auVar78 = vpmaxsd_avx(auVar40,auVar74);
                auVar108 = vpmaxsd_avx(auVar47,auVar80);
                auVar109 = vpminsd_avx(auVar78,auVar108);
                auVar78 = vpmaxsd_avx(auVar120,auVar86);
                auVar108 = vpmaxsd_avx(auVar100,(undefined1  [16])tray.tnear.field_0);
                auVar78 = vpminsd_avx(auVar109,auVar78);
                auVar78 = vpminsd_avx(auVar78,(undefined1  [16])tray.tfar.field_0);
                auVar78 = vcmpps_avx(auVar108,auVar78,2);
                if (uVar30 == 6) {
                  uVar31 = *(undefined4 *)(uVar34 + 0xf0 + lVar35);
                  auVar48._4_4_ = uVar31;
                  auVar48._0_4_ = uVar31;
                  auVar48._8_4_ = uVar31;
                  auVar48._12_4_ = uVar31;
                  auVar108 = vcmpps_avx(auVar48,auVar43,2);
                  uVar31 = *(undefined4 *)(uVar34 + 0x100 + lVar35);
                  auVar75._4_4_ = uVar31;
                  auVar75._0_4_ = uVar31;
                  auVar75._8_4_ = uVar31;
                  auVar75._12_4_ = uVar31;
                  auVar43 = vcmpps_avx(auVar43,auVar75,1);
                  auVar43 = vandps_avx(auVar108,auVar43);
                  auVar78 = vandps_avx(auVar43,auVar78);
                }
              }
              else {
                fVar82 = *(float *)(uVar34 + 0x60 + lVar35);
                fVar89 = *(float *)(uVar34 + 0x70 + lVar35);
                fVar57 = *(float *)(uVar34 + 0x80 + lVar35);
                fVar65 = *(float *)(uVar34 + 0x90 + lVar35);
                fVar66 = *(float *)(uVar34 + 0xa0 + lVar35);
                fVar67 = *(float *)(uVar34 + 0xf0 + lVar35);
                fVar1 = *(float *)(uVar34 + 0x100 + lVar35);
                fVar2 = *(float *)(uVar34 + 0x110 + lVar35);
                fVar3 = *(float *)(uVar34 + 0x120 + lVar35);
                fVar4 = *(float *)(uVar34 + 0x130 + lVar35);
                fVar5 = *(float *)(uVar34 + 0x140 + lVar35);
                auVar43 = *(undefined1 (*) [16])(ray + 0x70);
                auVar71._8_4_ = 0x3f800000;
                auVar71._0_8_ = 0x3f8000003f800000;
                auVar71._12_4_ = 0x3f800000;
                auVar78 = vsubps_avx(auVar71,auVar43);
                fVar115 = auVar43._0_4_;
                fVar116 = auVar43._4_4_;
                fVar117 = auVar43._8_4_;
                fVar118 = auVar43._12_4_;
                fVar119 = auVar78._0_4_;
                fVar124 = fVar119 * 0.0;
                fVar121 = auVar78._4_4_;
                fVar125 = fVar121 * 0.0;
                fVar122 = auVar78._8_4_;
                fVar126 = fVar122 * 0.0;
                fVar123 = auVar78._12_4_;
                fVar127 = fVar123 * 0.0;
                local_1968._4_4_ = fVar125 + fVar116 * fVar1;
                local_1968._0_4_ = fVar124 + fVar115 * fVar1;
                fStack_1960 = fVar126 + fVar117 * fVar1;
                fStack_195c = fVar127 + fVar118 * fVar1;
                fVar1 = *(float *)(uVar34 + 0xb0 + lVar35);
                fVar6 = *(float *)(uVar34 + 0x30 + lVar35);
                auVar102._0_4_ =
                     fVar6 * (float)tray.dir.field_0._0_4_ +
                     fVar82 * (float)tray.dir.field_0._16_4_ +
                     fVar65 * (float)tray.dir.field_0._32_4_;
                auVar102._4_4_ =
                     fVar6 * (float)tray.dir.field_0._4_4_ +
                     fVar82 * (float)tray.dir.field_0._20_4_ +
                     fVar65 * (float)tray.dir.field_0._36_4_;
                auVar102._8_4_ =
                     fVar6 * (float)tray.dir.field_0._8_4_ +
                     fVar82 * (float)tray.dir.field_0._24_4_ +
                     fVar65 * (float)tray.dir.field_0._40_4_;
                auVar102._12_4_ =
                     fVar6 * (float)tray.dir.field_0._12_4_ +
                     fVar82 * (float)tray.dir.field_0._28_4_ +
                     fVar65 * (float)tray.dir.field_0._44_4_;
                fVar7 = *(float *)(uVar34 + 0x40 + lVar35);
                auVar95._0_4_ =
                     fVar7 * (float)tray.dir.field_0._0_4_ +
                     fVar89 * (float)tray.dir.field_0._16_4_ +
                     fVar66 * (float)tray.dir.field_0._32_4_;
                auVar95._4_4_ =
                     fVar7 * (float)tray.dir.field_0._4_4_ +
                     fVar89 * (float)tray.dir.field_0._20_4_ +
                     fVar66 * (float)tray.dir.field_0._36_4_;
                auVar95._8_4_ =
                     fVar7 * (float)tray.dir.field_0._8_4_ +
                     fVar89 * (float)tray.dir.field_0._24_4_ +
                     fVar66 * (float)tray.dir.field_0._40_4_;
                auVar95._12_4_ =
                     fVar7 * (float)tray.dir.field_0._12_4_ +
                     fVar89 * (float)tray.dir.field_0._28_4_ +
                     fVar66 * (float)tray.dir.field_0._44_4_;
                fVar8 = *(float *)(uVar34 + 0x50 + lVar35);
                auVar49._0_4_ =
                     fVar8 * (float)tray.dir.field_0._0_4_ +
                     fVar57 * (float)tray.dir.field_0._16_4_ +
                     fVar1 * (float)tray.dir.field_0._32_4_;
                auVar49._4_4_ =
                     fVar8 * (float)tray.dir.field_0._4_4_ +
                     fVar57 * (float)tray.dir.field_0._20_4_ +
                     fVar1 * (float)tray.dir.field_0._36_4_;
                auVar49._8_4_ =
                     fVar8 * (float)tray.dir.field_0._8_4_ +
                     fVar57 * (float)tray.dir.field_0._24_4_ +
                     fVar1 * (float)tray.dir.field_0._40_4_;
                auVar49._12_4_ =
                     fVar8 * (float)tray.dir.field_0._12_4_ +
                     fVar57 * (float)tray.dir.field_0._28_4_ +
                     fVar1 * (float)tray.dir.field_0._44_4_;
                auVar60._8_4_ = 0x7fffffff;
                auVar60._0_8_ = 0x7fffffff7fffffff;
                auVar60._12_4_ = 0x7fffffff;
                auVar43 = vandps_avx(auVar102,auVar60);
                auVar107._8_4_ = 0x219392ef;
                auVar107._0_8_ = 0x219392ef219392ef;
                auVar107._12_4_ = 0x219392ef;
                auVar43 = vcmpps_avx(auVar43,auVar107,1);
                auVar78 = vblendvps_avx(auVar102,auVar107,auVar43);
                auVar43 = vandps_avx(auVar95,auVar60);
                auVar43 = vcmpps_avx(auVar43,auVar107,1);
                auVar100 = vblendvps_avx(auVar95,auVar107,auVar43);
                auVar43 = vandps_avx(auVar49,auVar60);
                auVar43 = vcmpps_avx(auVar43,auVar107,1);
                auVar43 = vblendvps_avx(auVar49,auVar107,auVar43);
                auVar108 = vrcpps_avx(auVar78);
                fVar44 = auVar108._0_4_;
                auVar87._0_4_ = fVar44 * auVar78._0_4_;
                fVar54 = auVar108._4_4_;
                auVar87._4_4_ = fVar54 * auVar78._4_4_;
                fVar55 = auVar108._8_4_;
                auVar87._8_4_ = fVar55 * auVar78._8_4_;
                fVar56 = auVar108._12_4_;
                auVar87._12_4_ = fVar56 * auVar78._12_4_;
                auVar78 = vsubps_avx(auVar71,auVar87);
                fVar44 = fVar44 + fVar44 * auVar78._0_4_;
                fVar54 = fVar54 + fVar54 * auVar78._4_4_;
                fVar55 = fVar55 + fVar55 * auVar78._8_4_;
                fVar56 = fVar56 + fVar56 * auVar78._12_4_;
                auVar78 = vrcpps_avx(auVar100);
                fVar83 = auVar78._0_4_;
                auVar96._0_4_ = fVar83 * auVar100._0_4_;
                fVar90 = auVar78._4_4_;
                auVar96._4_4_ = fVar90 * auVar100._4_4_;
                fVar91 = auVar78._8_4_;
                auVar96._8_4_ = fVar91 * auVar100._8_4_;
                fVar92 = auVar78._12_4_;
                auVar96._12_4_ = fVar92 * auVar100._12_4_;
                auVar78 = vsubps_avx(auVar71,auVar96);
                fVar83 = fVar83 + fVar83 * auVar78._0_4_;
                fVar90 = fVar90 + fVar90 * auVar78._4_4_;
                fVar91 = fVar91 + fVar91 * auVar78._8_4_;
                fVar92 = fVar92 + fVar92 * auVar78._12_4_;
                auVar78 = vrcpps_avx(auVar43);
                fVar93 = auVar78._0_4_;
                auVar103._0_4_ = auVar43._0_4_ * fVar93;
                fVar97 = auVar78._4_4_;
                auVar103._4_4_ = auVar43._4_4_ * fVar97;
                fVar98 = auVar78._8_4_;
                auVar103._8_4_ = auVar43._8_4_ * fVar98;
                fVar99 = auVar78._12_4_;
                auVar103._12_4_ = auVar43._12_4_ * fVar99;
                auVar43 = vsubps_avx(auVar71,auVar103);
                fVar93 = auVar43._0_4_ * fVar93 + fVar93;
                fVar97 = auVar43._4_4_ * fVar97 + fVar97;
                fVar98 = auVar43._8_4_ * fVar98 + fVar98;
                fVar99 = auVar43._12_4_ * fVar99 + fVar99;
                fVar9 = *(float *)(uVar34 + 0xc0 + lVar35);
                fVar10 = *(float *)(uVar34 + 0xd0 + lVar35);
                fVar11 = *(float *)(uVar34 + 0xe0 + lVar35);
                auVar104 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                auVar61._0_4_ =
                     fVar6 * (float)tray.org.field_0._0_4_ +
                     (float)tray.org.field_0._16_4_ * fVar82 +
                     fVar65 * (float)tray.org.field_0._32_4_ + fVar9;
                auVar61._4_4_ =
                     fVar6 * (float)tray.org.field_0._4_4_ +
                     (float)tray.org.field_0._20_4_ * fVar82 +
                     fVar65 * (float)tray.org.field_0._36_4_ + fVar9;
                auVar61._8_4_ =
                     fVar6 * (float)tray.org.field_0._8_4_ +
                     (float)tray.org.field_0._24_4_ * fVar82 +
                     fVar65 * (float)tray.org.field_0._40_4_ + fVar9;
                auVar61._12_4_ =
                     fVar6 * (float)tray.org.field_0._12_4_ +
                     (float)tray.org.field_0._28_4_ * fVar82 +
                     fVar65 * (float)tray.org.field_0._44_4_ + fVar9;
                auVar76._0_4_ =
                     fVar7 * (float)tray.org.field_0._0_4_ +
                     fVar10 + fVar66 * (float)tray.org.field_0._32_4_ +
                     (float)tray.org.field_0._16_4_ * fVar89;
                auVar76._4_4_ =
                     fVar7 * (float)tray.org.field_0._4_4_ +
                     fVar10 + fVar66 * (float)tray.org.field_0._36_4_ +
                     (float)tray.org.field_0._20_4_ * fVar89;
                auVar76._8_4_ =
                     fVar7 * (float)tray.org.field_0._8_4_ +
                     fVar10 + fVar66 * (float)tray.org.field_0._40_4_ +
                     (float)tray.org.field_0._24_4_ * fVar89;
                auVar76._12_4_ =
                     fVar7 * (float)tray.org.field_0._12_4_ +
                     fVar10 + fVar66 * (float)tray.org.field_0._44_4_ +
                     (float)tray.org.field_0._28_4_ * fVar89;
                auVar41._0_4_ =
                     fVar8 * (float)tray.org.field_0._0_4_ +
                     fVar57 * (float)tray.org.field_0._16_4_ +
                     fVar11 + (float)tray.org.field_0._32_4_ * fVar1;
                auVar41._4_4_ =
                     fVar8 * (float)tray.org.field_0._4_4_ +
                     fVar57 * (float)tray.org.field_0._20_4_ +
                     fVar11 + (float)tray.org.field_0._36_4_ * fVar1;
                auVar41._8_4_ =
                     fVar8 * (float)tray.org.field_0._8_4_ +
                     fVar57 * (float)tray.org.field_0._24_4_ +
                     fVar11 + (float)tray.org.field_0._40_4_ * fVar1;
                auVar41._12_4_ =
                     fVar8 * (float)tray.org.field_0._12_4_ +
                     fVar57 * (float)tray.org.field_0._28_4_ +
                     fVar11 + (float)tray.org.field_0._44_4_ * fVar1;
                auVar23._4_4_ = fVar125 + fVar116 * fVar67;
                auVar23._0_4_ = fVar124 + fVar115 * fVar67;
                auVar23._8_4_ = fVar126 + fVar117 * fVar67;
                auVar23._12_4_ = fVar127 + fVar118 * fVar67;
                auVar43 = vsubps_avx(auVar23,auVar61);
                auVar22._4_4_ = fVar121 + fVar116 * fVar3;
                auVar22._0_4_ = fVar119 + fVar115 * fVar3;
                auVar22._8_4_ = fVar122 + fVar117 * fVar3;
                auVar22._12_4_ = fVar123 + fVar118 * fVar3;
                auVar78 = vsubps_avx(auVar22,auVar61);
                auVar81._0_4_ = fVar44 * auVar43._0_4_;
                auVar81._4_4_ = fVar54 * auVar43._4_4_;
                auVar81._8_4_ = fVar55 * auVar43._8_4_;
                auVar81._12_4_ = fVar56 * auVar43._12_4_;
                auVar50._0_4_ = fVar44 * auVar78._0_4_;
                auVar50._4_4_ = fVar54 * auVar78._4_4_;
                auVar50._8_4_ = fVar55 * auVar78._8_4_;
                auVar50._12_4_ = fVar56 * auVar78._12_4_;
                auVar43 = vsubps_avx(_local_1968,auVar76);
                auVar24._4_4_ = fVar121 + fVar116 * fVar4;
                auVar24._0_4_ = fVar119 + fVar115 * fVar4;
                auVar24._8_4_ = fVar122 + fVar117 * fVar4;
                auVar24._12_4_ = fVar123 + fVar118 * fVar4;
                auVar78 = vsubps_avx(auVar24,auVar76);
                auVar62._0_4_ = fVar83 * auVar43._0_4_;
                auVar62._4_4_ = fVar90 * auVar43._4_4_;
                auVar62._8_4_ = fVar91 * auVar43._8_4_;
                auVar62._12_4_ = fVar92 * auVar43._12_4_;
                auVar77._0_4_ = fVar83 * auVar78._0_4_;
                auVar77._4_4_ = fVar90 * auVar78._4_4_;
                auVar77._8_4_ = fVar91 * auVar78._8_4_;
                auVar77._12_4_ = fVar92 * auVar78._12_4_;
                auVar18._4_4_ = fVar125 + fVar116 * fVar2;
                auVar18._0_4_ = fVar124 + fVar115 * fVar2;
                auVar18._8_4_ = fVar126 + fVar117 * fVar2;
                auVar18._12_4_ = fVar127 + fVar118 * fVar2;
                auVar43 = vsubps_avx(auVar18,auVar41);
                auVar88._0_4_ = fVar93 * auVar43._0_4_;
                auVar88._4_4_ = fVar97 * auVar43._4_4_;
                auVar88._8_4_ = fVar98 * auVar43._8_4_;
                auVar88._12_4_ = fVar99 * auVar43._12_4_;
                auVar19._4_4_ = fVar121 + fVar116 * fVar5;
                auVar19._0_4_ = fVar119 + fVar115 * fVar5;
                auVar19._8_4_ = fVar122 + fVar117 * fVar5;
                auVar19._12_4_ = fVar123 + fVar118 * fVar5;
                auVar43 = vsubps_avx(auVar19,auVar41);
                auVar42._0_4_ = fVar93 * auVar43._0_4_;
                auVar42._4_4_ = fVar97 * auVar43._4_4_;
                auVar42._8_4_ = fVar98 * auVar43._8_4_;
                auVar42._12_4_ = fVar99 * auVar43._12_4_;
                auVar43 = vpminsd_avx(auVar81,auVar50);
                auVar78 = vpminsd_avx(auVar62,auVar77);
                auVar43 = vpmaxsd_avx(auVar43,auVar78);
                auVar78 = vpminsd_avx(auVar88,auVar42);
                auVar100 = vpmaxsd_avx(auVar43,auVar78);
                auVar43 = vpmaxsd_avx(auVar81,auVar50);
                auVar78 = vpmaxsd_avx(auVar62,auVar77);
                auVar108 = vpminsd_avx(auVar43,auVar78);
                auVar43 = vpmaxsd_avx(auVar88,auVar42);
                auVar78 = vpmaxsd_avx(auVar100,(undefined1  [16])tray.tnear.field_0);
                auVar43 = vpminsd_avx(auVar108,auVar43);
                auVar43 = vpminsd_avx(auVar43,(undefined1  [16])tray.tfar.field_0);
                auVar78 = vcmpps_avx(auVar78,auVar43,2);
              }
              auVar43 = vandps_avx(auVar64,auVar78);
              auVar43 = vpslld_avx(auVar43,0x1f);
              if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar43 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar43 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar43[0xf]) {
                auVar53 = ZEXT1664(auVar51);
                root.ptr = sVar36;
              }
              else {
                auVar43 = vblendvps_avx(auVar104._0_16_,auVar100,auVar43);
                auVar53 = ZEXT1664(auVar43);
                if (sVar36 != 8) {
                  pNVar38->ptr = sVar36;
                  pNVar38 = pNVar38 + 1;
                  local_1978 = auVar51._0_8_;
                  uStack_1970 = auVar51._8_8_;
                  *(undefined8 *)paVar37 = local_1978;
                  *(undefined8 *)(paVar37->v + 2) = uStack_1970;
                  paVar37 = paVar37 + 1;
                }
              }
              auVar51 = auVar53._0_16_;
              lVar35 = lVar35 + 4;
              sVar36 = root.ptr;
            } while (lVar35 != 0);
            if (root.ptr == 8) goto LAB_003033f1;
            auVar64 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar53._0_16_,6);
            uVar31 = vmovmskps_avx(auVar64);
          } while ((byte)uVar33 < (byte)POPCOUNT(uVar31));
          pNVar38->ptr = root.ptr;
          pNVar38 = pNVar38 + 1;
          *paVar37 = auVar53._0_16_;
          paVar37 = paVar37 + 1;
        }
        else {
          do {
            sVar36 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> sVar36 & 1) == 0; sVar36 = sVar36 + 1) {
              }
            }
            bVar29 = occluded1(This,bvh,root,sVar36,&pre,ray,&tray,context);
            if (bVar29) {
              terminated.field_0.i[sVar36] = -1;
            }
            uVar34 = uVar34 & uVar34 - 1;
          } while (uVar34 != 0);
          auVar64 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar32 = 3;
          if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar64[0xf] < '\0') {
            auVar64._8_4_ = 0xff800000;
            auVar64._0_8_ = 0xff800000ff800000;
            auVar64._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar64,
                               (undefined1  [16])terminated.field_0);
            iVar32 = 2;
          }
          auVar104 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar53 = ZEXT1664((undefined1  [16])vVar12.field_0);
          if (uVar33 < uVar30) goto LAB_00302e65;
        }
LAB_003033f1:
      } while (iVar32 != 3);
LAB_003035db:
      auVar64 = vandps_avx(auVar52,(undefined1  [16])terminated.field_0);
      auVar52._8_4_ = 0xff800000;
      auVar52._0_8_ = 0xff800000ff800000;
      auVar52._12_4_ = 0xff800000;
      auVar64 = vmaskmovps_avx(auVar64,auVar52);
      *(undefined1 (*) [16])(ray + 0x80) = auVar64;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }